

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<rangeless::fn::impl::X> * __thiscall
rangeless::fn::impl::maybe<rangeless::fn::impl::X>::operator=
          (maybe<rangeless::fn::impl::X> *this,maybe<rangeless::fn::impl::X> *other)

{
  X *val;
  maybe<rangeless::fn::impl::X> *other_local;
  maybe<rangeless::fn::impl::X> *this_local;
  
  if (this != other) {
    if ((other->m_empty & 1U) == 0) {
      val = operator*(other);
      reset(this,val);
      reset(other);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }